

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

void cleanup_player_timed(void)

{
  timed_grade *ptVar1;
  timed_failure *ptVar2;
  timed_grade *next_1;
  timed_failure *next;
  timed_grade *grade;
  timed_failure *f;
  timed_effect_data *effect;
  size_t i;
  
  for (effect = (timed_effect_data *)0x0; effect < (timed_effect_data *)0x35;
      effect = (timed_effect_data *)((long)&effect->name + 1)) {
    next = (timed_failure *)timed_effects[(long)effect].grade;
    grade = (timed_grade *)timed_effects[(long)effect].fail;
    while (grade != (timed_grade *)0x0) {
      ptVar1 = *(timed_grade **)grade;
      mem_free(grade);
      grade = ptVar1;
    }
    timed_effects[(long)effect].fail = (timed_failure *)0x0;
    while (next != (timed_failure *)0x0) {
      ptVar2 = *(timed_failure **)&next[2].code;
      string_free((char *)next[1].next);
      string_free(*(char **)&next[1].code);
      string_free((char *)next[2].next);
      mem_free(next);
      next = ptVar2;
    }
    timed_effects[(long)effect].grade = (timed_grade *)0x0;
    string_free(timed_effects[(long)effect].desc);
    timed_effects[(long)effect].desc = (char *)0x0;
    string_free(timed_effects[(long)effect].on_end);
    timed_effects[(long)effect].on_end = (char *)0x0;
    string_free(timed_effects[(long)effect].on_increase);
    timed_effects[(long)effect].on_increase = (char *)0x0;
    string_free(timed_effects[(long)effect].on_decrease);
    timed_effects[(long)effect].on_decrease = (char *)0x0;
    timed_effects[(long)effect].msgt = 0;
    free_effect(timed_effects[(long)effect].on_begin_effect);
    timed_effects[(long)effect].on_begin_effect = (effect *)0x0;
    free_effect(timed_effects[(long)effect].on_end_effect);
    timed_effects[(long)effect].on_end_effect = (effect *)0x0;
    timed_effects[(long)effect].flags = '\0';
    timed_effects[(long)effect].lower_bound = 0;
    timed_effects[(long)effect].oflag_dup = 0;
    timed_effects[(long)effect].oflag_syn = false;
    timed_effects[(long)effect].temp_resist = -1;
    timed_effects[(long)effect].temp_brand = -1;
    timed_effects[(long)effect].temp_slay = -1;
  }
  return;
}

Assistant:

static void cleanup_player_timed(void)
{
	/*
	 * Besides cleaning up any dynamically allocated resources, revert
	 * any fields set during parsing to their default values so the
	 * timed_effects array is back to where it started after its static
	 * initialization.
	 */
	for (size_t i = 0; i < TMD_MAX; i++) {
		struct timed_effect_data *effect = &timed_effects[i];
		struct timed_failure *f = effect->fail;
		struct timed_grade *grade = effect->grade;

		while (f) {
			struct timed_failure *next = f->next;

			mem_free(f);
			f = next;
		}
		effect->fail = NULL;

		while (grade) {
			struct timed_grade *next = grade->next;
			string_free(grade->name);
			string_free(grade->up_msg);
			string_free(grade->down_msg);
			mem_free(grade);
			grade = next;
		}
		effect->grade = NULL;

		string_free(effect->desc);
		effect->desc = NULL;

		string_free(effect->on_end);
		effect->on_end = NULL;
		string_free(effect->on_increase);
		effect->on_increase = NULL;
		string_free(effect->on_decrease);
		effect->on_decrease = NULL;
		effect->msgt = 0;

		free_effect(effect->on_begin_effect);
		effect->on_begin_effect = NULL;
		free_effect(effect->on_end_effect);
		effect->on_end_effect = NULL;

		effect->flags = 0;
		effect->lower_bound = 0;
		effect->oflag_dup = OF_NONE;
		effect->oflag_syn = false;
		effect->temp_resist = -1;
		effect->temp_brand = -1;
		effect->temp_slay = -1;
	}
}